

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::B44Compressor::compress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  int b;
  uint uVar4;
  ChannelData *pCVar5;
  char *pcVar6;
  ushort *puVar7;
  int i_2;
  int iVar8;
  int iVar9;
  uint uVar10;
  const_iterator cVar11;
  ConstIterator CVar12;
  ulong uVar13;
  byte bVar14;
  ushort uVar15;
  int i;
  uint uVar16;
  uint uVar17;
  unsigned_short *puVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  unsigned_short *puVar24;
  byte bVar25;
  unsigned_short *puVar26;
  uint uVar27;
  int x;
  long lVar28;
  int y;
  int iVar29;
  uint uVar30;
  int i_6;
  uint uVar31;
  long lVar32;
  ushort *__dest;
  unsigned_short *puVar33;
  size_t sVar34;
  char *inPtr_local;
  B44Compressor *local_198;
  ulong local_190;
  uint local_184;
  uint local_180;
  uint local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  ChannelData *local_158;
  unsigned_short *local_150;
  unsigned_short *local_148;
  unsigned_short *local_140;
  unsigned_short *local_138;
  ushort *local_130;
  unsigned_short s [16];
  int d [16];
  uint auStack_c8 [18];
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  unsigned_short t [16];
  
  *outPtr = this->_outBuffer;
  if (inSize == 0) {
    iVar9 = 0;
  }
  else {
    local_190 = CONCAT44(local_190._4_4_,(range->min).x);
    iVar9 = (range->max).x;
    if (this->_maxX < iVar9) {
      iVar9 = this->_maxX;
    }
    iVar29 = (range->min).y;
    b = (range->max).y;
    if (this->_maxY < b) {
      b = this->_maxY;
    }
    puVar18 = this->_tmpBuffer;
    inPtr_local = inPtr;
    cVar11._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    lVar32 = 0;
    while (CVar12 = ChannelList::end(this->_channels),
          (const_iterator)cVar11._M_node != CVar12._i._M_node) {
      pCVar5 = this->_channelData;
      *(unsigned_short **)((long)&pCVar5->start + lVar32) = puVar18;
      *(unsigned_short **)((long)&pCVar5->end + lVar32) = puVar18;
      iVar8 = numSamples(*(int *)&cVar11._M_node[9].field_0x4,(int)local_190,iVar9);
      *(int *)((long)&pCVar5->nx + lVar32) = iVar8;
      iVar8 = numSamples(*(int *)&cVar11._M_node[9]._M_parent,iVar29,b);
      *(int *)((long)&pCVar5->ny + lVar32) = iVar8;
      puVar18 = puVar18 + (long)*(int *)((long)&pCVar5->size + lVar32) *
                          (long)iVar8 * (long)*(int *)((long)&pCVar5->nx + lVar32);
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
      lVar32 = lVar32 + 0x28;
    }
    local_198 = this;
    if (this->_format == XDR) {
      for (; iVar29 <= b; iVar29 = iVar29 + 1) {
        for (lVar32 = 0; lVar32 < this->_numChans; lVar32 = lVar32 + 1) {
          pCVar5 = this->_channelData;
          iVar9 = Imath_2_5::modp(iVar29,pCVar5[lVar32].ys);
          if (iVar9 == 0) {
            iVar9 = pCVar5[lVar32].nx;
            if (pCVar5[lVar32].type == HALF) {
              for (; 0 < iVar9; iVar9 = iVar9 + -1) {
                Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&inPtr_local,pCVar5[lVar32].end);
                pCVar5[lVar32].end = pCVar5[lVar32].end + 1;
              }
            }
            else {
              lVar28 = (long)pCVar5[lVar32].size * (long)iVar9;
              sVar34 = lVar28 * 2;
              memcpy(pCVar5[lVar32].end,inPtr_local,sVar34);
              inPtr_local = inPtr_local + sVar34;
              pCVar5[lVar32].end = pCVar5[lVar32].end + lVar28;
            }
          }
        }
      }
    }
    else {
      for (; iVar29 <= b; iVar29 = iVar29 + 1) {
        lVar32 = 8;
        for (lVar28 = 0; lVar28 < this->_numChans; lVar28 = lVar28 + 1) {
          pCVar5 = this->_channelData;
          iVar9 = Imath_2_5::modp(iVar29,*(int *)((long)&pCVar5->nx + lVar32));
          pcVar6 = inPtr_local;
          if (iVar9 == 0) {
            lVar19 = (long)*(int *)((long)&pCVar5->type + lVar32) *
                     (long)*(int *)((long)&pCVar5->end + lVar32);
            sVar34 = lVar19 * 2;
            memcpy(*(void **)((long)&pCVar5->start + lVar32),inPtr_local,sVar34);
            inPtr_local = pcVar6 + lVar19 * 2;
            plVar1 = (long *)((long)&pCVar5->start + lVar32);
            *plVar1 = *plVar1 + sVar34;
            this = local_198;
          }
          lVar32 = lVar32 + 0x28;
        }
      }
    }
    __dest = (ushort *)this->_outBuffer;
    for (local_80 = 0; local_80 < this->_numChans; local_80 = local_80 + 1) {
      pCVar5 = this->_channelData + local_80;
      if (this->_channelData[local_80].type == HALF) {
        uVar27 = 0;
        while (uVar20 = uVar27, iVar9 = pCVar5->ny, local_158 = pCVar5, (int)uVar20 < iVar9) {
          uVar13 = (ulong)pCVar5->nx;
          puVar24 = pCVar5->start + (int)(pCVar5->nx * uVar20);
          puVar18 = puVar24 + uVar13;
          puVar26 = puVar18 + uVar13;
          if ((int)(uVar20 | 3) < iVar9) {
            puVar33 = puVar26 + uVar13;
          }
          else {
            if (iVar9 <= (int)(uVar20 | 1)) {
              puVar18 = puVar24;
            }
            puVar33 = puVar26;
            if (iVar9 <= (int)(uVar20 | 2)) {
              puVar26 = puVar18;
              puVar33 = puVar18;
            }
          }
          puVar7 = __dest;
          for (uVar27 = 0; __dest = puVar7, iVar9 = (int)uVar13, (int)uVar27 < iVar9;
              uVar27 = uVar27 + 4) {
            if ((int)(uVar27 | 3) < iVar9) {
              s._0_8_ = *(undefined8 *)puVar24;
              s._8_8_ = *(undefined8 *)puVar18;
              s._16_8_ = *(undefined8 *)puVar26;
              s._24_8_ = *(undefined8 *)puVar33;
            }
            else {
              for (lVar32 = 0; lVar32 != 4; lVar32 = lVar32 + 1) {
                iVar29 = (int)lVar32;
                if ((int)(iVar9 + ~uVar27) < (int)lVar32) {
                  iVar29 = iVar9 + ~uVar27;
                }
                s[lVar32] = puVar24[iVar29];
                s[lVar32 + 4] = puVar18[iVar29];
                s[lVar32 + 8] = puVar26[iVar29];
                s[lVar32 + 0xc] = puVar33[iVar29];
              }
            }
            bVar2 = pCVar5->pLinear;
            if (bVar2 == true) {
              for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 1) {
                s[lVar32] = *(unsigned_short *)
                             ((anonymous_namespace)::expTable + (ulong)s[lVar32] * 2);
              }
            }
            puVar24 = puVar24 + 4;
            puVar18 = puVar18 + 4;
            puVar26 = puVar26 + 4;
            puVar33 = puVar33 + 4;
            bVar3 = this->_optFlatFields;
            for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 1) {
              uVar15 = s[lVar32];
              if ((~uVar15 & 0x7c00) == 0) {
                t[lVar32] = 0x8000;
              }
              else {
                if ((short)uVar15 < 0) {
                  uVar15 = ~uVar15;
                }
                else {
                  uVar15 = uVar15 | 0x8000;
                }
                t[lVar32] = uVar15;
              }
            }
            local_180 = 0;
            for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 1) {
              if ((ushort)local_180 <= t[lVar32]) {
                local_180 = (uint)t[lVar32];
              }
            }
            iVar9 = -1;
            do {
              iVar29 = iVar9 + 1;
              bVar14 = (byte)iVar29;
              for (lVar32 = 0; lVar32 != 0x10; lVar32 = lVar32 + 1) {
                uVar22 = (local_180 - t[lVar32]) * 2;
                d[lVar32] = (int)(uVar22 + ~(-1 << (bVar14 & 0x1f)) +
                                 (uint)((uVar22 >> (iVar9 + 2U & 0x1f) & 1) != 0)) >>
                            ((byte)(iVar9 + 2U) & 0x1f);
              }
              uVar31 = d[0] - d[4];
              local_78 = (ulong)uVar31;
              uVar10 = d[4] - d[8];
              local_70 = (ulong)uVar10;
              local_15c = uVar10 + 0x20;
              auStack_c8[1] = local_15c;
              auStack_c8[2] = (d[8] - d[0xc]) + 0x20;
              auStack_c8[3] = (d[0] - d[1]) + 0x20;
              local_164 = (d[4] - d[5]) + 0x20;
              auStack_c8[4] = local_164;
              uVar23 = d[8] - d[9];
              local_190 = (ulong)uVar23;
              local_160 = uVar23 + 0x20;
              auStack_c8[5] = local_160;
              auStack_c8[6] = (d[0xc] - d[0xd]) + 0x20;
              auStack_c8[7] = (d[1] - d[2]) + 0x20;
              local_170 = (d[5] - d[6]) + 0x20;
              auStack_c8[8] = local_170;
              local_16c = (d[9] - d[10]) + 0x20;
              auStack_c8[9] = local_16c;
              auStack_c8[10] = (d[0xd] - d[0xe]) + 0x20;
              auStack_c8[0xb] = (d[2] - d[3]) + 0x20;
              uVar16 = d[6] - d[7];
              local_60 = (ulong)uVar16;
              local_174 = uVar16 + 0x20;
              auStack_c8[0xc] = local_174;
              uVar21 = d[10] - d[0xb];
              local_68 = (ulong)uVar21;
              local_168 = uVar21 + 0x20;
              auStack_c8[0xd] = local_168;
              auStack_c8[0xe] = (d[0xe] - d[0xf]) + 0x20;
              uVar17 = uVar31 + 0x20;
              uVar22 = uVar17;
              uVar30 = uVar17;
              for (lVar32 = 1; lVar32 != 0xf; lVar32 = lVar32 + 1) {
                uVar4 = auStack_c8[lVar32];
                if ((int)uVar4 <= (int)uVar22) {
                  uVar22 = uVar4;
                }
                if ((int)uVar30 <= (int)uVar4) {
                  uVar30 = uVar4;
                }
              }
              iVar9 = iVar29;
            } while (((int)uVar22 < 0) || (0x3f < (int)uVar30));
            uVar15 = t[0];
            if ((uVar22 == 0x20) && ((uVar30 == 0x20 && (bVar25 = 0xfc, bVar3 != false)))) {
              lVar32 = 2;
              lVar28 = 3;
            }
            else {
              if (bVar2 == false) {
                uVar15 = (ushort)local_180 - (short)(d[0] << (bVar14 & 0x1f));
              }
              *(byte *)(__dest + 1) = (byte)(uVar17 >> 4) | bVar14 * '\x04';
              *(byte *)((long)__dest + 3) = (byte)(local_15c >> 2) | (char)uVar31 * '\x10';
              *(byte *)(__dest + 2) = (byte)auStack_c8[2] | (char)uVar10 * '@';
              *(byte *)((long)__dest + 5) = (byte)(local_164 >> 4) | (char)auStack_c8[3] * '\x04';
              *(byte *)(__dest + 3) = (byte)(local_160 >> 2) | (char)(d[4] - d[5]) * '\x10';
              *(byte *)((long)__dest + 7) = (byte)auStack_c8[6] | (char)uVar23 * '@';
              *(byte *)(__dest + 4) = (byte)(local_170 >> 4) | (char)auStack_c8[7] * '\x04';
              *(byte *)((long)__dest + 9) = (byte)(local_16c >> 2) | (char)(d[5] - d[6]) * '\x10';
              *(byte *)(__dest + 5) = (byte)auStack_c8[10] | (char)(d[9] - d[10]) * '@';
              *(byte *)((long)__dest + 0xb) =
                   (byte)(local_174 >> 4) | (char)auStack_c8[0xb] * '\x04';
              *(byte *)(__dest + 6) = (byte)(local_168 >> 2) | (char)uVar16 * '\x10';
              bVar25 = (byte)auStack_c8[0xe] | (char)uVar21 * '@';
              lVar32 = 0xd;
              lVar28 = 0xe;
            }
            *__dest = uVar15 << 8 | uVar15 >> 8;
            *(byte *)((long)__dest + lVar32) = bVar25;
            uVar13 = (ulong)(uint)pCVar5->nx;
            this = local_198;
            puVar7 = (ushort *)((long)__dest + lVar28);
            local_17c = uVar27;
            local_150 = puVar33;
            local_148 = puVar26;
            local_140 = puVar18;
            local_138 = puVar24;
            local_130 = __dest;
          }
          local_184 = uVar20;
          uVar27 = uVar20 + 4;
        }
      }
      else {
        sVar34 = (size_t)(pCVar5->nx * pCVar5->ny * pCVar5->size * 2);
        memcpy(__dest,pCVar5->start,sVar34);
        __dest = (ushort *)((long)__dest + sVar34);
      }
    }
    iVar9 = (int)__dest - *(int *)&this->_outBuffer;
  }
  return iVar9;
}

Assistant:

int
B44Compressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // Compress a block of pixel data:  First copy the input pixels
    // from the input buffer into _tmpBuffer, rearranging them such
    // that blocks of 4x4 pixels of a single channel can be accessed
    // conveniently.  Then compress each 4x4 block of HALF pixel data
    // and append the result to the output buffer.  Copy UINT and
    // FLOAT data to the output buffer without compressing them.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	//
	// Special case - empty input buffer.
	//

	return 0;
    }

    //
    // For each channel, detemine how many pixels are stored
    // in the input buffer, and where those pixels will be
    // placed in _tmpBuffer.
    //

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// The data in the input buffer are in the machine-independent
	// Xdr format.  Copy the HALF channels into _tmpBuffer and
	// convert them back into native format for compression.
	// Copy UINT and FLOAT channels verbatim into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::read <CharPtrIO> (inPtr, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		    inPtr += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	//
	// The input buffer contains only HALF channels, and they
	// are in native, machine-dependent format.  Copy the pixels
	// into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    //
    // The pixels for each channel have been packed into a contiguous
    // block in _tmpBuffer.  HALF channels are in native format; UINT
    // and FLOAT channels are in Xdr format.
    //

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // For each HALF channel, split the data in _tmpBuffer into 4x4
    // pixel blocks.  Compress each block and append the compressed
    // data to the output buffer.
    //
    // UINT and FLOAT channels are copied from _tmpBuffer into the
    // output buffer without further processing.
    //

    char *outEnd = _outBuffer;

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];
	
	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);
	    memcpy (outEnd, cd.start, n);
	    outEnd += n;

	    continue;
	}
	
	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    //
	    // Copy the next 4x4 pixel block into array s.
	    // If the width, cd.nx, or the height, cd.ny, of
	    // the pixel data in _tmpBuffer is not divisible
	    // by 4, then pad the data by repeating the
	    // rightmost column and the bottom row.
	    // 

	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    if (y + 3 >= cd.ny)
	    {
		if (y + 1 >= cd.ny)
		    row1 = row0;

		if (y + 2 >= cd.ny)
		    row2 = row1;

		row3 = row2;
	    }

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16];

		if (x + 3 >= cd.nx)
		{
		    int n = cd.nx - x;

		    for (int i = 0; i < 4; ++i)
		    {
			int j = min (i, n - 1);

			s[i +  0] = row0[j];
			s[i +  4] = row1[j];
			s[i +  8] = row2[j];
			s[i + 12] = row3[j];
		    }
		}
		else
		{
		    memcpy (&s[ 0], row0, 4 * sizeof (unsigned short));
		    memcpy (&s[ 4], row1, 4 * sizeof (unsigned short));
		    memcpy (&s[ 8], row2, 4 * sizeof (unsigned short));
		    memcpy (&s[12], row3, 4 * sizeof (unsigned short));
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;

		//
		// Compress the contents of array s and append the
		// results to the output buffer.
		//

		if (cd.pLinear)
		    convertFromLinear (s);

		outEnd += pack (s, (unsigned char *) outEnd,
				_optFlatFields, !cd.pLinear);
	    }
	}
    }

    return outEnd - _outBuffer;
}